

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.cpp
# Opt level: O3

void nodecpp::VirtualMemory::deallocate(void *ptr,size_t size)

{
  int iVar1;
  int *piVar2;
  char *obj_3;
  undefined8 *puVar3;
  ModuleID local_28;
  
  if ((size & 0xfff) != 0) {
    assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/page_allocator.cpp"
               ,0x55,"size % 4096 == 0",true);
  }
  iVar1 = munmap(ptr,size);
  if (iVar1 != -1) {
    return;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  local_28.str = "foundation";
  obj_3 = strerror(iVar1);
  log::default_log::error<char_const*,unsigned_long,unsigned_long,int,char*>
            (&local_28,"munmap error at deallocate(0x{:x}, 0x{:x}), error = {} ({})",
             (unsigned_long)ptr,size,iVar1,obj_3);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = clock_gettime;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void VirtualMemory::deallocate(void* ptr, size_t size)
{
	NODECPP_ASSERT(nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, size % 4096 == 0 );
	int ret = munmap(ptr, size);
 	if ( ret == -1 )
	{
		int e = errno;
		nodecpp::log::default_log::error( nodecpp::log::ModuleID(nodecpp::foundation_module_id), "munmap error at deallocate(0x{:x}, 0x{:x}), error = {} ({})", (size_t)(ptr), size, e, strerror(e) );
//		nodecpp::log::default_log::error( nodecpp::log::ModuleID(nodecpp::foundation_module_id), "munmap error at deallocate({}), error = {} ({})", size, e, strerror(e) );
		throw std::bad_alloc();
	}
}